

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

void __thiscall
Scene::render(Scene *this,Shadow shadow,bool light_projection,int display_w,int display_h,
             ResourcePack *resource_pack,Camera *camera)

{
  GLenum err;
  char *__s;
  size_t sVar1;
  
  if (shadow == NoShadow) {
    shadow = NoShadow;
  }
  else {
    render_pass(this,GenerateDepthMap,shadow,light_projection,display_w,display_h,resource_pack,
                camera);
  }
  render_pass(this,Display,shadow,light_projection,display_w,display_h,resource_pack,camera);
  err = glGetError();
  while (err != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"GL Error: ",10);
    __s = get_gl_err_str(err);
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    err = glGetError();
  }
  return;
}

Assistant:

void Scene::render(Shadow shadow, bool light_projection, int display_w, int display_h, ResourcePack& resource_pack, Camera& camera) {
    if (shadow != Shadow::NoShadow) {
        // Generate depth map
        render_pass(RenderPass::GenerateDepthMap, shadow, light_projection, display_w, display_h, resource_pack, camera);
    }

    // Render objects
    render_pass(RenderPass::Display, shadow, light_projection, display_w, display_h, resource_pack, camera);

    // Debug OpenGl errors
    GLenum err;
    while((err = glGetError()) != GL_NO_ERROR) {
        std::cout << "GL Error: " << get_gl_err_str(err) << std::endl;
    }
}